

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O3

void __thiscall
capnp::compiler::CompilerMain::readOneAndConvert
          (CompilerMain *this,BufferedInputStreamWrapper *input,OutputStream *output)

{
  RawBrandedSchema *pRVar1;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Builder output_00;
  Reader reader_02;
  Reader reader_03;
  Builder output_01;
  Reader reader_04;
  SegmentReader *pSVar2;
  uchar *puVar3;
  RemoveConst<unsigned_char> *pRVar4;
  uchar *puVar5;
  InputStream __dest;
  Disposer *firstElement;
  capnp *pcVar6;
  size_t extraout_RDX;
  ulong uVar7;
  capnp *pcVar8;
  word *ptrCopy;
  Impl *pIVar9;
  ReaderOptions options;
  ReaderOptions options_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_char> input_00;
  ArrayPtr<const_unsigned_char> packedBytes;
  ArrayPtr<const_unsigned_char> array;
  ArrayPtr<unsigned_char> dstArray;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  StringPtr input_01;
  ReaderOptions options_01;
  ReaderOptions options_02;
  Vector<unsigned_char> allBytes;
  Array<capnp::word> words;
  DebugExpression<bool> _kjCondition;
  Fault f;
  PackedInputStream unpacker;
  ArrayPtr<const_capnp::word> segments [1];
  word dummy;
  SegmentArrayMessageReader message;
  ArrayPtr<const_capnp::word> segments_1 [1];
  ParseErrorCatcher parseErrorCatcher;
  Vector<unsigned_char> local_4d8;
  JsonCodec local_4b8;
  undefined8 *local_4a8;
  undefined1 local_498 [16];
  WirePointer *local_488;
  int iStack_480;
  undefined4 uStack_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  PointerReader local_468;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  PackedInputStream local_428;
  ArrayInputStream local_418;
  uchar local_3f8 [8];
  undefined1 local_3f0 [312];
  StructReader local_2b8;
  StructReader local_288;
  StructReader local_258;
  StructReader local_228;
  ArrayPtr<const_capnp::word> local_1f8;
  ParseErrorCatcher local_1e8;
  
  ParseErrorCatcher::ParseErrorCatcher(&local_1e8,this->context);
  switch(this->convertFrom) {
  case BINARY:
    options._8_8_ = 0x7fffffff;
    options.traversalLimitInWords = 0xffffffffffffffff;
    InputStreamMessageReader::InputStreamMessageReader
              ((InputStreamMessageReader *)local_3f0,(InputStream *)input,options,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal((Reader *)local_498,(MessageReader *)local_3f0);
    local_468.segment = (SegmentReader *)CONCAT71(local_498._1_7_,local_498[0]);
    local_468.pointer = local_488;
    local_468.nestingLimit = iStack_480;
    local_468._28_4_ = uStack_47c;
    local_468.capTable = (CapTableReader *)local_498._8_8_;
    capnp::_::PointerReader::getStruct(&local_228,&local_468,(word *)0x0);
    reader_00._reader.capTable = local_228.capTable;
    reader_00._reader.segment = local_228.segment;
    reader_00._reader.data = local_228.data;
    reader_00._reader.pointers = local_228.pointers;
    reader_00._reader.dataSize = local_228.dataSize;
    reader_00._reader.pointerCount = local_228.pointerCount;
    reader_00._reader._38_2_ = local_228._38_2_;
    reader_00._reader.nestingLimit = local_228.nestingLimit;
    reader_00._reader._44_4_ = local_228._44_4_;
    writeConversion(this,reader_00,output);
    InputStreamMessageReader::~InputStreamMessageReader((InputStreamMessageReader *)local_3f0);
    break;
  case PACKED:
    options_00._8_8_ = 0x7fffffff;
    options_00.traversalLimitInWords = 0xffffffffffffffff;
    PackedMessageReader::PackedMessageReader
              ((PackedMessageReader *)local_3f0,&input->super_BufferedInputStream,options_00,
               (ArrayPtr<capnp::word>)ZEXT816(0));
    MessageReader::getRootInternal((Reader *)local_498,(MessageReader *)(local_3f0 + 0x10));
    local_468.segment = (SegmentReader *)CONCAT71(local_498._1_7_,local_498[0]);
    local_468.pointer = local_488;
    local_468.nestingLimit = iStack_480;
    local_468._28_4_ = uStack_47c;
    local_468.capTable = (CapTableReader *)local_498._8_8_;
    capnp::_::PointerReader::getStruct(&local_258,&local_468,(word *)0x0);
    reader_01._reader.capTable = local_258.capTable;
    reader_01._reader.segment = local_258.segment;
    reader_01._reader.data = local_258.data;
    reader_01._reader.pointers = local_258.pointers;
    reader_01._reader.dataSize = local_258.dataSize;
    reader_01._reader.pointerCount = local_258.pointerCount;
    reader_01._reader._38_2_ = local_258._38_2_;
    reader_01._reader.nestingLimit = local_258.nestingLimit;
    reader_01._reader._44_4_ = local_258._44_4_;
    writeConversion(this,reader_01,output);
    PackedMessageReader::~PackedMessageReader((PackedMessageReader *)local_3f0);
    break;
  case FLAT:
  case CANONICAL:
    readAll(&local_4d8,this,input);
    uVar7 = (long)local_4d8.builder.pos - (long)local_4d8.builder.ptr;
    pIVar9 = (Impl *)(uVar7 >> 3);
    __dest._vptr_InputStream =
         (_func_int **)
         kj::_::HeapArrayDisposer::allocateImpl
                   (8,(size_t)pIVar9,(size_t)pIVar9,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr *)0x0);
    local_4a8 = &kj::_::HeapArrayDisposer::instance;
    local_4b8.impl.disposer = (Disposer *)__dest._vptr_InputStream;
    local_4b8.impl.ptr = pIVar9;
    memcpy(__dest._vptr_InputStream,local_4d8.builder.ptr,uVar7 & 0xfffffffffffffff8);
    segments_00.size_ = 1;
    segments_00.ptr = (ArrayPtr<const_capnp::word> *)&local_418;
    options_01._8_8_ = 0x7fffffff;
    options_01.traversalLimitInWords = 0xffffffffffffffff;
    local_418.super_BufferedInputStream.super_InputStream._vptr_InputStream =
         (InputStream)(InputStream)__dest._vptr_InputStream;
    local_418.array.ptr = (uchar *)pIVar9;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_3f0,segments_00,options_01);
    if ((this->convertFrom == CANONICAL) &&
       (local_498[0] = MessageReader::isCanonical((MessageReader *)local_3f0), !local_498[0])) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                ((Fault *)&local_468,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x423,FAILED,"message.isCanonical()","_kjCondition,",
                 (DebugExpression<bool> *)local_498);
      kj::_::Debug::Fault::fatal((Fault *)&local_468);
    }
    MessageReader::getRootInternal((Reader *)local_498,(MessageReader *)local_3f0);
    local_468.segment = (SegmentReader *)CONCAT71(local_498._1_7_,local_498[0]);
    local_468.pointer = local_488;
    local_468.nestingLimit = iStack_480;
    local_468._28_4_ = uStack_47c;
    local_468.capTable = (CapTableReader *)local_498._8_8_;
    capnp::_::PointerReader::getStruct(&local_288,&local_468,(word *)0x0);
    reader._reader.capTable = local_288.capTable;
    reader._reader.segment = local_288.segment;
    reader._reader.data = local_288.data;
    reader._reader.pointers = local_288.pointers;
    reader._reader.dataSize = local_288.dataSize;
    reader._reader.pointerCount = local_288.pointerCount;
    reader._reader._38_2_ = local_288._38_2_;
    reader._reader.nestingLimit = local_288.nestingLimit;
    reader._reader._44_4_ = local_288._44_4_;
    writeConversion(this,reader,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_3f0);
    if (__dest._vptr_InputStream != (_func_int **)0x0) {
      local_4b8.impl.disposer = (Disposer *)0x0;
      local_4b8.impl.ptr = (Impl *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__dest._vptr_InputStream,8
                 ,(size_t)pIVar9,(size_t)pIVar9,(_func_void_void_ptr *)0x0);
    }
    puVar5 = local_4d8.builder.endPtr;
    pRVar4 = local_4d8.builder.pos;
    puVar3 = local_4d8.builder.ptr;
    if ((capnp *)local_4d8.builder.ptr != (capnp *)0x0) {
      local_4d8.builder.ptr = (uchar *)0x0;
      local_4d8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_4d8.builder.endPtr = (uchar *)0x0;
      (**(local_4d8.builder.disposer)->_vptr_ArrayDisposer)
                (local_4d8.builder.disposer,puVar3,1,(long)pRVar4 - (long)puVar3,
                 (long)puVar5 - (long)puVar3,0);
    }
    break;
  case FLAT_PACKED:
    readAll(&local_4d8,this,input);
    packedBytes.ptr = (capnp *)(local_4d8.builder.pos + -(long)local_4d8.builder.ptr);
    packedBytes.size_ = extraout_RDX;
    pIVar9 = (Impl *)computeUnpackedSizeInWords((capnp *)local_4d8.builder.ptr,packedBytes);
    firstElement = (Disposer *)
                   kj::_::HeapArrayDisposer::allocateImpl
                             (8,(size_t)pIVar9,(size_t)pIVar9,(_func_void_void_ptr *)0x0,
                              (_func_void_void_ptr *)0x0);
    local_4a8 = &kj::_::HeapArrayDisposer::instance;
    array.size_ = (long)local_4d8.builder.pos - (long)local_4d8.builder.ptr;
    array.ptr = local_4d8.builder.ptr;
    local_4b8.impl.disposer = firstElement;
    local_4b8.impl.ptr = pIVar9;
    kj::ArrayInputStream::ArrayInputStream(&local_418,array);
    capnp::_::PackedInputStream::PackedInputStream(&local_428,&local_418.super_BufferedInputStream);
    kj::InputStream::read
              (&local_428.super_InputStream,(int)firstElement,(void *)((long)pIVar9 << 3),
               (size_t)((long)pIVar9 << 3));
    dstArray.size_ = 8;
    dstArray.ptr = local_3f8;
    local_3f0._0_8_ = capnp::_::PackedInputStream::tryRead(&local_428,dstArray,8);
    local_3f0._8_4_ = 0;
    local_3f0._16_8_ = " == ";
    local_3f0._24_8_ = (void *)0x5;
    local_3f0[0x20] = (_func_int **)local_3f0._0_8_ == (_func_int **)0x0;
    if (!local_3f0[0x20]) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&>
                ((Fault *)&local_468,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                 ,0x42f,FAILED,
                 "unpacker.tryRead(kj::arrayPtr(&dummy, 1).asBytes(), sizeof(dummy)) == 0",
                 "_kjCondition,",(DebugComparison<unsigned_long,_int> *)local_3f0);
      kj::_::Debug::Fault::fatal((Fault *)&local_468);
    }
    segments_01.size_ = 1;
    segments_01.ptr = &local_1f8;
    options_02._8_8_ = 0x7fffffff;
    options_02.traversalLimitInWords = 0xffffffffffffffff;
    local_1f8.ptr = (word *)firstElement;
    local_1f8.size_ = (size_t)pIVar9;
    SegmentArrayMessageReader::SegmentArrayMessageReader
              ((SegmentArrayMessageReader *)local_3f0,segments_01,options_02);
    MessageReader::getRootInternal((Reader *)local_498,(MessageReader *)local_3f0);
    local_468.segment = (SegmentReader *)CONCAT71(local_498._1_7_,local_498[0]);
    local_468.pointer = local_488;
    local_468.nestingLimit = iStack_480;
    local_468._28_4_ = uStack_47c;
    local_468.capTable = (CapTableReader *)local_498._8_8_;
    capnp::_::PointerReader::getStruct(&local_2b8,&local_468,(word *)0x0);
    reader_03._reader.capTable = local_2b8.capTable;
    reader_03._reader.segment = local_2b8.segment;
    reader_03._reader.data = local_2b8.data;
    reader_03._reader.pointers = local_2b8.pointers;
    reader_03._reader.dataSize = local_2b8.dataSize;
    reader_03._reader.pointerCount = local_2b8.pointerCount;
    reader_03._reader._38_2_ = local_2b8._38_2_;
    reader_03._reader.nestingLimit = local_2b8.nestingLimit;
    reader_03._reader._44_4_ = local_2b8._44_4_;
    writeConversion(this,reader_03,output);
    SegmentArrayMessageReader::~SegmentArrayMessageReader((SegmentArrayMessageReader *)local_3f0);
    capnp::_::PackedInputStream::~PackedInputStream(&local_428);
    kj::BufferedInputStream::~BufferedInputStream(&local_418.super_BufferedInputStream);
    if (firstElement != (Disposer *)0x0) {
      local_4b8.impl.disposer = (Disposer *)0x0;
      local_4b8.impl.ptr = (Impl *)0x0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,8,
                 (size_t)pIVar9,(size_t)pIVar9,(_func_void_void_ptr *)0x0);
    }
    puVar5 = local_4d8.builder.endPtr;
    pRVar4 = local_4d8.builder.pos;
    puVar3 = local_4d8.builder.ptr;
    if ((capnp *)local_4d8.builder.ptr != (capnp *)0x0) {
      local_4d8.builder.ptr = (uchar *)0x0;
      local_4d8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      local_4d8.builder.endPtr = (uchar *)0x0;
      (**(local_4d8.builder.disposer)->_vptr_ArrayDisposer)
                (local_4d8.builder.disposer,puVar3,1,(long)pRVar4 - (long)puVar3,
                 (long)puVar5 - (long)puVar3,0);
    }
    break;
  case TEXT:
    readOneText((String *)&local_4d8,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_3f0,0x400,GROW_HEURISTICALLY);
    TextCodec::TextCodec((TextCodec *)&local_4b8);
    TextCodec::setPrettyPrint((TextCodec *)&local_4b8,this->pretty);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_468,(MessageBuilder *)local_3f0);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_498,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar8 = (capnp *)local_4d8.builder.ptr;
    if ((capnp *)local_4d8.builder.pos == (capnp *)0x0) {
      pcVar8 = (capnp *)0x229f1b;
    }
    input_01.content.size_ =
         (capnp *)(local_4d8.builder.pos + ((capnp *)local_4d8.builder.pos == (capnp *)0x0));
    output_01.schema.super_Schema.raw._1_7_ = local_498._1_7_;
    output_01.schema.super_Schema.raw._0_1_ = local_498[0];
    output_01.builder.segment = (SegmentBuilder *)local_498._8_8_;
    output_01.builder.capTable = (CapTableBuilder *)local_488;
    output_01.builder.data = (void *)_iStack_480;
    output_01.builder.pointers = (WirePointer *)local_478;
    output_01.builder.dataSize = (undefined4)uStack_470;
    output_01.builder.pointerCount = uStack_470._4_2_;
    output_01.builder._38_2_ = uStack_470._6_2_;
    input_01.content.ptr = (char *)pcVar8;
    TextCodec::decode((TextCodec *)&local_4b8,input_01,output_01);
    pSVar2 = (SegmentReader *)CONCAT71(local_498._1_7_,local_498[0]);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_498 + 8));
    reader_04._reader.capTable = (CapTableReader *)local_468.pointer;
    reader_04._reader.segment = (SegmentReader *)local_468.capTable;
    reader_04._reader.data = (void *)local_468._24_8_;
    reader_04._reader.pointers = (WirePointer *)uStack_448;
    reader_04._reader.dataSize = (undefined4)local_440;
    reader_04._reader.pointerCount = local_440._4_2_;
    reader_04._reader._38_2_ = local_440._6_2_;
    reader_04._reader._40_8_ = uStack_438;
    local_468.segment = pSVar2;
    writeConversion(this,reader_04,output);
    TextCodec::~TextCodec((TextCodec *)&local_4b8);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_3f0);
    pRVar4 = local_4d8.builder.pos;
    puVar3 = local_4d8.builder.ptr;
    if ((capnp *)local_4d8.builder.ptr != (capnp *)0x0) {
      local_4d8.builder.ptr = (uchar *)0x0;
      local_4d8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_4d8.builder.endPtr)
                (local_4d8.builder.endPtr,puVar3,1,pRVar4,pRVar4,0);
    }
    break;
  case JSON:
    readOneJson((String *)&local_4d8,this,input);
    MallocMessageBuilder::MallocMessageBuilder
              ((MallocMessageBuilder *)local_3f0,0x400,GROW_HEURISTICALLY);
    JsonCodec::JsonCodec(&local_4b8);
    JsonCodec::setPrettyPrint(&local_4b8,this->pretty);
    JsonCodec::handleByAnnotation(&local_4b8,(this->rootType).super_Schema.raw);
    pRVar1 = (this->rootType).super_Schema.raw;
    MessageBuilder::getRootInternal((Builder *)&local_468,(MessageBuilder *)local_3f0);
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
              ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)local_498,
               (EVP_PKEY_CTX *)pRVar1);
    pcVar8 = (capnp *)local_4d8.builder.pos;
    if ((capnp *)local_4d8.builder.pos != (capnp *)0x0) {
      pcVar8 = (capnp *)local_4d8.builder.ptr;
    }
    pcVar6 = (capnp *)0x0;
    if ((capnp *)local_4d8.builder.pos != (capnp *)0x0) {
      pcVar6 = (capnp *)(local_4d8.builder.pos + -1);
    }
    output_00.schema.super_Schema.raw._1_7_ = local_498._1_7_;
    output_00.schema.super_Schema.raw._0_1_ = local_498[0];
    output_00.builder.segment = (SegmentBuilder *)local_498._8_8_;
    output_00.builder.capTable = (CapTableBuilder *)local_488;
    output_00.builder.data = (void *)_iStack_480;
    output_00.builder.pointers = (WirePointer *)local_478;
    output_00.builder.dataSize = (undefined4)uStack_470;
    output_00.builder.pointerCount = uStack_470._4_2_;
    output_00.builder._38_2_ = uStack_470._6_2_;
    input_00.size_ = (size_t)pcVar6;
    input_00.ptr = (char *)pcVar8;
    JsonCodec::decode(&local_4b8,input_00,output_00);
    pSVar2 = (SegmentReader *)CONCAT71(local_498._1_7_,local_498[0]);
    capnp::_::StructBuilder::asReader((StructBuilder *)(local_498 + 8));
    reader_02._reader.capTable = (CapTableReader *)local_468.pointer;
    reader_02._reader.segment = (SegmentReader *)local_468.capTable;
    reader_02._reader.data = (void *)local_468._24_8_;
    reader_02._reader.pointers = (WirePointer *)uStack_448;
    reader_02._reader.dataSize = (undefined4)local_440;
    reader_02._reader.pointerCount = local_440._4_2_;
    reader_02._reader._38_2_ = local_440._6_2_;
    reader_02._reader._40_8_ = uStack_438;
    local_468.segment = pSVar2;
    writeConversion(this,reader_02,output);
    JsonCodec::~JsonCodec(&local_4b8);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_3f0);
    pRVar4 = local_4d8.builder.pos;
    puVar3 = local_4d8.builder.ptr;
    if ((capnp *)local_4d8.builder.ptr != (capnp *)0x0) {
      local_4d8.builder.ptr = (uchar *)0x0;
      local_4d8.builder.pos = (RemoveConst<unsigned_char> *)0x0;
      (*(code *)**(undefined8 **)local_4d8.builder.endPtr)
                (local_4d8.builder.endPtr,puVar3,1,pRVar4,pRVar4,0);
    }
    break;
  default:
    kj::_::unreachable();
  }
  ParseErrorCatcher::~ParseErrorCatcher(&local_1e8);
  return;
}

Assistant:

void readOneAndConvert(kj::BufferedInputStreamWrapper& input, kj::OutputStream& output) {
    // Since this is a debug tool, lift the usual security limits.  Worse case is the process
    // crashes or has to be killed.
    ReaderOptions options;
    options.nestingLimit = kj::maxValue;
    options.traversalLimitInWords = kj::maxValue;

    ParseErrorCatcher parseErrorCatcher(context);

    switch (convertFrom) {
      case Format::BINARY: {
        capnp::InputStreamMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::PACKED: {
        capnp::PackedMessageReader message(input, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT:
      case Format::CANONICAL: {
        auto allBytes = readAll(input);

        // Technically we don't know if the bytes are aligned so we'd better copy them to a new
        // array. Note that if we have a non-whole number of words we chop off the straggler
        // bytes. This is fine because if those bytes are actually part of the message we will
        // hit an error later and if they are not then who cares?
        auto words = kj::heapArray<word>(allBytes.size() / sizeof(word));
        memcpy(words.begin(), allBytes.begin(), words.size() * sizeof(word));

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        if (convertFrom == Format::CANONICAL) {
          KJ_REQUIRE(message.isCanonical());
        }
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::FLAT_PACKED: {
        auto allBytes = readAll(input);

        auto words = kj::heapArray<word>(computeUnpackedSizeInWords(allBytes));
        kj::ArrayInputStream input(allBytes);
        capnp::_::PackedInputStream unpacker(input);
        unpacker.read(words.asBytes());
        word dummy;
        KJ_ASSERT(unpacker.tryRead(kj::arrayPtr(&dummy, 1).asBytes(), sizeof(dummy)) == 0);

        kj::ArrayPtr<const word> segments[1] = { words };
        SegmentArrayMessageReader message(segments, options);
        return writeConversion(message.getRoot<AnyStruct>(), output);
      }
      case Format::TEXT: {
        auto text = readOneText(input);
        MallocMessageBuilder message;
        TextCodec codec;
        codec.setPrettyPrint(pretty);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
      case Format::JSON: {
        auto text = readOneJson(input);
        MallocMessageBuilder message;
        JsonCodec codec;
        codec.setPrettyPrint(pretty);
        codec.handleByAnnotation(rootType);
        auto root = message.initRoot<DynamicStruct>(rootType);
        codec.decode(text, root);
        return writeConversion(root.asReader(), output);
      }
    }

    KJ_UNREACHABLE;
  }